

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O3

double ON_ArrayDotProduct(int dim,double *A,double *B)

{
  long lVar1;
  double dVar2;
  double dVar3;
  
  switch(dim) {
  case 0:
    return 0.0;
  case 1:
    return *A * *B;
  case 2:
    dVar3 = A[1] * B[1];
    dVar2 = *A * *B;
    break;
  case 3:
    dVar3 = *A * *B + A[1] * B[1];
    dVar2 = A[2] * B[2];
    break;
  case 4:
    dVar3 = A[2] * B[2] + *A * *B + A[1] * B[1];
    dVar2 = A[3] * B[3];
    break;
  default:
    dVar2 = 0.0;
    lVar1 = 0;
    do {
      dVar2 = dVar2 + A[lVar1] * B[lVar1];
      lVar1 = lVar1 + 1;
    } while (dim != (int)lVar1);
    return dVar2;
  }
  return dVar2 + dVar3;
}

Assistant:

double ON_ArrayDotProduct(int dim, const double* A, const double* B)
{
  double AoB;
  // do low dimensional cases on one line so we get 80 bit
  // intermediate precision in optimized mode.
  if (dim==1) return (A[0]*B[0]);
  if (dim==2) return (A[0]*B[0] + A[1]*B[1]);
  if (dim==3) return (A[0]*B[0] + A[1]*B[1] + A[2]*B[2]);
  if (dim==4) return (A[0]*B[0] + A[1]*B[1] + A[2]*B[2] +A[3]*B[3]);
  AoB = 0.0;
  while (dim--) AoB += *A++ * *B++;
  return AoB;
}